

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  uint uVar1;
  ulong uVar2;
  vec<3U,_float> *pvVar3;
  float *pfVar4;
  row_vec *prVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint i_3;
  vec<3U,_float> *pvVar11;
  uint i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double sum;
  double dVar21;
  double local_628;
  double local_620;
  double local_618;
  vec<3U,_float> axis;
  vec<3U,_float> centroid;
  vec<3U,_float> new_left_child;
  vec<3U,_float> left_child;
  vec<3U,_float> right_child;
  vec<3U,_float> local_58c;
  vec<3U,_float> new_right_child;
  matrix<3U,_3U,_float> covar;
  vec<3U,_float> furthest;
  vec<3U,_float> opposite;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  
  vec<3U,_float>::clear(&centroid);
  uVar2 = (ulong)size;
  local_628 = 0.0;
  pvVar3 = weightedVectors;
  uVar13 = 0;
  uVar8 = 0;
  pvVar11 = *vectors;
  for (; uVar2 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = (*weights)[uVar8];
    fVar16 = (float)uVar1;
    operator*(pvVar11,fVar16);
    vec<3U,_float>::operator=(pvVar3,covar.m_rows);
    vec<3U,_float>::operator+=(&centroid,pvVar3);
    uVar13 = uVar13 + uVar1;
    fVar17 = operator*(pvVar11,pvVar11);
    dVar19 = (double)(fVar17 * fVar16);
    weightedDotProducts[uVar8] = dVar19;
    local_628 = local_628 + dVar19;
    pvVar11 = pvVar11 + 1;
    pvVar3 = pvVar3 + 1;
  }
  fVar16 = operator*(&centroid,&centroid);
  fVar17 = (float)uVar13;
  vec<3U,_float>::operator*=(&centroid,1.0 / fVar17);
  pvVar3 = vec<3U,_float>::operator=(*result + 1,&centroid);
  vec<3U,_float>::operator=(*result,pvVar3);
  if ((size != 1) && (0.0 < (float)(local_628 - (double)(fVar16 / fVar17)))) {
    fVar16 = -1.0;
    pvVar3 = *vectors;
    uVar8 = uVar2;
    while (bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
      fVar18 = vec<3U,_float>::squared_distance(pvVar3,&centroid);
      if (fVar16 < fVar18) {
        vec<3U,_float>::operator=(&furthest,pvVar3);
        fVar16 = fVar18;
      }
      pvVar3 = pvVar3 + 1;
    }
    fVar16 = -1.0;
    pvVar3 = *vectors;
    uVar8 = uVar2;
    while (bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
      fVar18 = vec<3U,_float>::squared_distance(pvVar3,&furthest);
      if (fVar16 < fVar18) {
        vec<3U,_float>::operator=(&opposite,pvVar3);
        fVar16 = fVar18;
      }
      pvVar3 = pvVar3 + 1;
    }
    operator+(&furthest,&centroid);
    operator*(covar.m_rows,0.5);
    operator+(&opposite,&centroid);
    operator*(covar.m_rows,0.5);
    if (2 < size) {
      matrix<3U,_3U,_float>::clear(&covar);
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        operator-(*vectors + uVar8,&centroid);
        operator*(&axis,(float)(*weights)[uVar8]);
        lVar7 = 0;
        pfVar4 = new_left_child.m_s;
        pfVar6 = (float *)&covar;
        for (; lVar7 != 3; lVar7 = lVar7 + 1) {
          for (lVar9 = 0; lVar7 + lVar9 != 3; lVar9 = lVar9 + 1) {
            pfVar6[lVar9] = axis.m_s[lVar7] * pfVar4[lVar9] + pfVar6[lVar9];
          }
          pfVar6 = pfVar6 + 4;
          pfVar4 = pfVar4 + 1;
        }
      }
      pfVar4 = (float *)&covar;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        lVar10 = 0;
        for (lVar9 = -3; lVar7 + lVar9 != 0; lVar9 = lVar9 + 1) {
          fVar16 = pfVar4[lVar9 + 3];
          pfVar4[lVar9 + 3] = fVar16 / fVar17;
          *(float *)((long)pfVar4 + lVar10) = fVar16 / fVar17;
          lVar10 = lVar10 + 0xc;
        }
        pfVar4 = pfVar4 + 4;
      }
      vec<3U,_float>::set(&axis,1.0);
      for (iVar12 = 0; iVar12 != 10; iVar12 = iVar12 + 1) {
        prVar5 = covar.m_rows;
        dVar19 = 0.0;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          dVar21 = 0.0;
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            dVar21 = dVar21 + (double)(axis.m_s[lVar9] * ((row_vec *)prVar5->m_s)->m_s[lVar9]);
          }
          new_left_child.m_s[lVar7] = (float)dVar21;
          dVar20 = dVar21;
          if ((lVar7 != 0) && (dVar20 = dVar19, dVar19 <= dVar21)) {
            dVar20 = dVar21;
          }
          prVar5 = prVar5 + 1;
          dVar19 = dVar20;
        }
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          vec<3U,_float>::operator*=(&new_left_child,(float)(1.0 / dVar19));
        }
        vec<3U,_float>::operator=(&axis,&new_left_child);
      }
      vec<3U,_float>::normalize(&axis,(vec<3U,_float> *)0x0);
      vec<3U,_float>::set(&new_left_child,0.0);
      vec<3U,_float>::set(&new_right_child,0.0);
      local_620 = 0.0;
      pvVar3 = weightedVectors;
      local_618 = 0.0;
      uVar8 = 0;
      pvVar11 = *vectors;
      for (; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        uVar1 = (*weights)[uVar8];
        operator-(pvVar11,&centroid);
        fVar16 = operator*(&local_58c,&axis);
        if (0.0 <= fVar16) {
          vec<3U,_float>::operator+=(&new_right_child,pvVar3);
          local_618 = local_618 + (double)uVar1;
        }
        else {
          vec<3U,_float>::operator+=(&new_left_child,pvVar3);
          local_620 = local_620 + (double)uVar1;
        }
        pvVar11 = pvVar11 + 1;
        pvVar3 = pvVar3 + 1;
      }
      if ((0.0 < local_620) && (0.0 < local_618)) {
        operator*(&new_left_child,(float)(1.0 / local_620));
        vec<3U,_float>::operator=(&left_child,&local_58c);
        operator*(&new_right_child,(float)(1.0 / local_618));
        vec<3U,_float>::operator=(&right_child,&local_58c);
      }
    }
    fVar16 = 1e+10;
    for (iVar12 = 0; iVar12 != 0x400; iVar12 = iVar12 + 1) {
      vec<3U,_float>::clear(covar.m_rows);
      vec<3U,_float>::clear(&axis);
      local_620 = 0.0;
      pvVar3 = weightedVectors;
      uVar8 = 0;
      uVar14 = 0;
      local_618 = 0.0;
      uVar13 = 0;
      pvVar11 = *vectors;
      for (; uVar2 != uVar13; uVar13 = uVar13 + 1) {
        fVar17 = vec<3U,_float>::squared_distance(&left_child,pvVar11);
        fVar18 = vec<3U,_float>::squared_distance(&right_child,pvVar11);
        if (fVar18 <= fVar17) {
          vec<3U,_float>::operator+=(&axis,pvVar3);
          local_618 = local_618 + weightedDotProducts[uVar13];
          uVar14 = uVar14 + (*weights)[uVar13];
        }
        else {
          vec<3U,_float>::operator+=(covar.m_rows,pvVar3);
          local_620 = local_620 + weightedDotProducts[uVar13];
          uVar8 = uVar8 + (*weights)[uVar13];
        }
        pvVar11 = pvVar11 + 1;
        pvVar3 = pvVar3 + 1;
      }
      if (uVar8 == 0) {
        return;
      }
      if (uVar14 == 0) {
        return;
      }
      fVar17 = operator*(covar.m_rows,covar.m_rows);
      fVar18 = operator*(&axis,&axis);
      fVar17 = (float)(local_618 - (double)(fVar18 / (float)uVar14)) +
               (float)(local_620 - (double)(fVar17 / (float)uVar8));
      vec<3U,_float>::operator*=(covar.m_rows,1.0 / (float)uVar8);
      vec<3U,_float>::operator*=(&axis,1.0 / (float)uVar14);
      vec<3U,_float>::operator=(&left_child,covar.m_rows);
      vec<3U,_float>::operator=(&right_child,&axis);
      if ((fVar17 < 1e-05) || ((fVar16 - fVar17) / fVar17 < 1e-05)) break;
      fVar16 = fVar17;
    }
    vec<3U,_float>::operator=(*result,&left_child);
    vec<3U,_float>::operator=(*result + 1,&right_child);
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }